

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Game.cpp
# Opt level: O0

bool __thiscall Game::play(Game *this)

{
  byte bVar1;
  bool bVar2;
  ostream *poVar3;
  byte local_39;
  bool local_19;
  Game *pGStack_18;
  bool quit;
  Game *this_local;
  
  pGStack_18 = this;
  poVar3 = std::operator<<((ostream *)&std::cout,"--= Coloring Game by Uriya Harpeness =--");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<((ostream *)&std::cout,"Try to fill the whole board (");
  bVar1 = Board::get_height(&this->m_board);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,(uint)bVar1);
  poVar3 = std::operator<<(poVar3,"X");
  bVar1 = Board::get_width(&this->m_board);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,(uint)bVar1);
  poVar3 = std::operator<<(poVar3,") in ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,this->m_moves);
  poVar3 = std::operator<<(poVar3," moves or less.");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<((ostream *)&std::cout,
                           "Controls are: \'r\' - red, \'g\' - green, \'b\' - blue, \'y\' - yellow, \'c\' - cyan, \'m\' - magenta, \'u\' - undo, \'s\' - change base, \'q\' ESC DEL BACKSPACE - quit."
                          );
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  local_19 = false;
  while( true ) {
    bVar2 = Board::solved(&this->m_board);
    local_39 = 0;
    if ((!bVar2) && (local_39 = 0, this->m_moves != 0)) {
      local_39 = local_19 ^ 0xff;
    }
    if ((local_39 & 1) == 0) break;
    turn(this,&local_19);
  }
  if ((local_19 & 1U) == 0) {
    Board::print(&this->m_board,this->m_moves);
    bVar2 = Board::solved(&this->m_board);
    if (bVar2) {
      poVar3 = std::operator<<((ostream *)&std::cout,"--= Congrats you win =--");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      this_local._7_1_ = true;
    }
    else {
      poVar3 = std::operator<<((ostream *)&std::cout,"--= Boo you lose =--");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      this_local._7_1_ = false;
    }
  }
  else {
    poVar3 = (ostream *)
             std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
    poVar3 = std::operator<<(poVar3,"--= Rookie move... =--");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool Game::play() {
    // Display title.
    cout << "--= Coloring Game by Uriya Harpeness =--" << endl << endl;
    cout << "Try to fill the whole board (" << (int) m_board.get_height() << "X" << (int) m_board.get_width() << ") in "
         << m_moves << " moves or less." << endl;
    cout << "Controls are: 'r' - red, 'g' - green, 'b' - blue, 'y' - yellow, 'c' - cyan, 'm' - magenta, 'u' - undo"
            ", 's' - change base, 'q' ESC DEL BACKSPACE - quit." << endl;

    bool quit = false;
    // Run the game.
    while (!m_board.solved() && (m_moves > 0) && !quit) {
        turn(quit);
    }

    // Disqualification.
    if (quit) {
        cout << endl << "--= Rookie move... =--" << endl;
        return false;
    }

    m_board.print(m_moves);

    if (m_board.solved()) {
        // Victory.
        cout << "--= Congrats you win =--" << endl;
        return true;
    } else {
        // Defeat.
        cout << "--= Boo you lose =--" << endl;
        return false;
    }
}